

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::
     WriteConstantDelta(char constant,char frame_of_reference,idx_t count,char *values,
                       bool *validity,void *data_ptr)

{
  long lVar1;
  
  ReserveSpace((BitpackingCompressionState<signed_char,_true,_signed_char> *)data_ptr,2);
  WriteMetaData((BitpackingCompressionState<signed_char,_true,_signed_char> *)data_ptr,
                CONSTANT_DELTA);
  **(char **)((long)data_ptr + 0x40) = frame_of_reference;
  lVar1 = *(long *)((long)data_ptr + 0x40);
  *(long *)((long)data_ptr + 0x40) = lVar1 + 1;
  *(char *)(lVar1 + 1) = constant;
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + 1;
  UpdateStats((BitpackingCompressionState<signed_char,_true,_signed_char> *)data_ptr,count);
  return;
}

Assistant:

static void WriteConstantDelta(T_S constant, T frame_of_reference, idx_t count, T *values, bool *validity,
		                               void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, 2 * sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT_DELTA);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}